

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O1

void __thiscall
embree::TutorialApplication::TutorialApplication
          (TutorialApplication *this,string *tutorialName,int features,int w,int h)

{
  atomic<unsigned_long> *paVar1;
  CommandLineParser *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
  *this_01;
  pointer pcVar2;
  double dVar3;
  CommandLineOption *pCVar4;
  mapped_type *pmVar5;
  pointer *__ptr;
  Ref<embree::CommandLineParser::CommandLineOption> closure;
  value_type local_d0;
  key_type local_c8;
  undefined1 *local_a8;
  long local_a0;
  undefined1 local_98 [16];
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  Averaged<double> *local_68;
  Averaged<double> *local_60;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  string *local_40;
  Averaged<double> *local_38;
  
  Application::Application(&this->super_Application,features);
  (this->super_Application)._vptr_Application = (_func_int **)&PTR__TutorialApplication_002bfe28;
  this->window = (GLFWwindow *)0x0;
  local_40 = &this->tutorialName;
  local_48 = &(this->tutorialName).field_2;
  (this->tutorialName)._M_dataplus._M_p = (pointer)local_48;
  pcVar2 = (tutorialName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar2,pcVar2 + tutorialName->_M_string_length);
  (this->animated_camera).ptr = (PerspectiveCameraNode *)0x0;
  *(undefined8 *)&(this->camera).from.field_0 = 0x38d1b71738d1b717;
  *(undefined8 *)((long)&(this->camera).from.field_0 + 8) = 0xc0400000;
  *(undefined8 *)&(this->camera).to.field_0 = 0;
  *(undefined8 *)((long)&(this->camera).to.field_0 + 8) = 0;
  *(undefined8 *)&(this->camera).up.field_0 = 0x3f80000000000000;
  *(undefined8 *)((long)&(this->camera).up.field_0 + 8) = 0;
  (this->camera).fov = 90.0;
  (this->camera).handedness = RIGHT_HANDED;
  this->width = w;
  this->height = h;
  this->pixels = (uint *)0x0;
  FileName::FileName(&this->outputImageFilename,"");
  FileName::FileName(&this->referenceImageFilename,"");
  this->referenceImageThreshold = 35.0;
  this->numFrames = 1;
  this->interactive = true;
  this->fullscreen = false;
  this->window_width = 0x400;
  this->window_height = 0x400;
  dVar3 = getSeconds();
  this->time0 = dVar3;
  this->debug_int0 = 0;
  this->debug_int1 = 0;
  this->mouseMode = 0;
  this->clickX = 0.0;
  this->clickY = 0.0;
  *(undefined8 *)&this->speed = 0x3f800000;
  *(undefined8 *)((long)&(this->moveDelta).field_0 + 4) = 0;
  this->animate = true;
  this->render_time = 0.0;
  this->command_line_camera = false;
  this->print_frame_rate = false;
  (this->avg_render_time).values.
  super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->avg_render_time).values.
  super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->avg_render_time).values.
  super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->avg_render_time).values.
  super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->avg_render_time).values.
  super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->avg_render_time).values.
  super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->avg_render_time).values.
  super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->avg_render_time).values.
  super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->avg_render_time).values.
  super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->avg_render_time).values.
  super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  _M_initialize_map((_Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     *)&this->avg_render_time,0);
  (this->avg_render_time).N = 0x40;
  (this->avg_render_time).dt = 1.0;
  (this->avg_frame_time).values.
  super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->avg_frame_time).values.
  super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->avg_frame_time).values.
  super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->avg_frame_time).values.
  super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->avg_frame_time).values.
  super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->avg_frame_time).values.
  super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->avg_frame_time).values.
  super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->avg_frame_time).values.
  super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->avg_frame_time).values.
  super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->avg_frame_time).values.
  super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  _M_initialize_map((_Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     *)&this->avg_frame_time,0);
  (this->avg_frame_time).N = 0x40;
  (this->avg_frame_time).dt = 1.0;
  (this->avg_mrayps).values.
  super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->avg_mrayps).values.
  super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->avg_mrayps).values.
  super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->avg_mrayps).values.
  super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->avg_mrayps).values.
  super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->avg_mrayps).values.
  super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->avg_mrayps).values.
  super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->avg_mrayps).values.
  super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->avg_mrayps).values.
  super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->avg_mrayps).values.
  super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  _M_initialize_map((_Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     *)&this->avg_mrayps,0);
  (this->avg_mrayps).N = 0x40;
  (this->avg_mrayps).dt = 1.0;
  this->print_camera = false;
  this->debug0 = 0;
  this->debug1 = 0;
  this->debug2 = 0;
  this->debug3 = 0;
  this->iflags_coherent = RTC_RAY_QUERY_FLAG_COHERENT;
  this->iflags_incoherent = RTC_RAY_QUERY_FLAG_INCOHERENT;
  (this->ispc_scene)._M_t.
  super___uniq_ptr_impl<embree::ISPCScene,_std::default_delete<embree::ISPCScene>_>._M_t.
  super__Tuple_impl<0UL,_embree::ISPCScene_*,_std::default_delete<embree::ISPCScene>_>.
  super__Head_base<0UL,_embree::ISPCScene_*,_false>._M_head_impl = (ISPCScene *)0x0;
  local_4c = MXCSR;
  local_54 = MXCSR | 0x8000;
  MXCSR = MXCSR | 0x8040;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  instance = this;
  local_68 = &this->avg_frame_time;
  local_60 = &this->avg_render_time;
  local_58 = MXCSR;
  local_50 = local_54;
  local_38 = &this->avg_mrayps;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"c","");
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"-c <filename>: parses command line option from <filename>","");
  pCVar4 = (CommandLineOption *)operator_new(0x38);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_a8,local_a8 + local_a0);
  (pCVar4->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c1620;
  (pCVar4->description)._M_dataplus._M_p = (pointer)&(pCVar4->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar4->description,local_88,local_88 + local_80);
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002bff38;
  pCVar4[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar4->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  this_00 = &(this->super_Application).commandLineParser;
  local_d0.ptr = pCVar4;
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_d0);
  this_01 = &(this->super_Application).commandLineParser.commandLineOptionMap;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_c8);
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar5->ptr != (CommandLineOption *)0x0) {
    (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar5->ptr = local_d0.ptr;
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"o","");
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"-o <filename>: output image filename","");
  pCVar4 = (CommandLineOption *)operator_new(0x38);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_a8,local_a8 + local_a0);
  (pCVar4->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c1620;
  (pCVar4->description)._M_dataplus._M_p = (pointer)&(pCVar4->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar4->description,local_88,local_88 + local_80);
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002bff88;
  pCVar4[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar4->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_d0.ptr = pCVar4;
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_d0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_c8);
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar5->ptr != (CommandLineOption *)0x0) {
    (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar5->ptr = local_d0.ptr;
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"compare","");
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"--compare <filename>: reference image to compare against","");
  pCVar4 = (CommandLineOption *)operator_new(0x38);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_a8,local_a8 + local_a0);
  (pCVar4->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c1620;
  (pCVar4->description)._M_dataplus._M_p = (pointer)&(pCVar4->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar4->description,local_88,local_88 + local_80);
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002bffd8;
  pCVar4[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar4->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_d0.ptr = pCVar4;
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_d0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_c8);
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar5->ptr != (CommandLineOption *)0x0) {
    (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar5->ptr = local_d0.ptr;
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"compare-threshold","");
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,
             "--compare-threshold <float>: threshold in number of wrong pixels when image is considered wrong"
             ,"");
  pCVar4 = (CommandLineOption *)operator_new(0x38);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_a8,local_a8 + local_a0);
  (pCVar4->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c1620;
  (pCVar4->description)._M_dataplus._M_p = (pointer)&(pCVar4->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar4->description,local_88,local_88 + local_80);
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c0028;
  pCVar4[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar4->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_d0.ptr = pCVar4;
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_d0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_c8);
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar5->ptr != (CommandLineOption *)0x0) {
    (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar5->ptr = local_d0.ptr;
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"frames","");
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,
             "--frames <int>: number of frames to render in compare or output mode","");
  pCVar4 = (CommandLineOption *)operator_new(0x38);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_a8,local_a8 + local_a0);
  (pCVar4->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c1620;
  (pCVar4->description)._M_dataplus._M_p = (pointer)&(pCVar4->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar4->description,local_88,local_88 + local_80);
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c0078;
  pCVar4[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar4->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_d0.ptr = pCVar4;
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_d0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_c8);
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar5->ptr != (CommandLineOption *)0x0) {
    (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar5->ptr = local_d0.ptr;
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"vp","");
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"--vp <float> <float> <float>: camera position","");
  pCVar4 = (CommandLineOption *)operator_new(0x38);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_a8,local_a8 + local_a0);
  (pCVar4->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c1620;
  (pCVar4->description)._M_dataplus._M_p = (pointer)&(pCVar4->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar4->description,local_88,local_88 + local_80);
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c00c8;
  pCVar4[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar4->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_d0.ptr = pCVar4;
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_d0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_c8);
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar5->ptr != (CommandLineOption *)0x0) {
    (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar5->ptr = local_d0.ptr;
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"vi","");
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"--vi <float> <float> <float>: camera lookat position","");
  pCVar4 = (CommandLineOption *)operator_new(0x38);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_a8,local_a8 + local_a0);
  (pCVar4->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c1620;
  (pCVar4->description)._M_dataplus._M_p = (pointer)&(pCVar4->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar4->description,local_88,local_88 + local_80);
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c0118;
  pCVar4[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar4->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_d0.ptr = pCVar4;
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_d0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_c8);
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar5->ptr != (CommandLineOption *)0x0) {
    (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar5->ptr = local_d0.ptr;
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"vd","");
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"--vd <float> <float> <float>: camera direction vector","");
  pCVar4 = (CommandLineOption *)operator_new(0x38);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_a8,local_a8 + local_a0);
  (pCVar4->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c1620;
  (pCVar4->description)._M_dataplus._M_p = (pointer)&(pCVar4->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar4->description,local_88,local_88 + local_80);
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c0168;
  pCVar4[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar4->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_d0.ptr = pCVar4;
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_d0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_c8);
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar5->ptr != (CommandLineOption *)0x0) {
    (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar5->ptr = local_d0.ptr;
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"vu","");
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"--vu <float> <float> <float>: camera up vector","");
  pCVar4 = (CommandLineOption *)operator_new(0x38);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_a8,local_a8 + local_a0);
  (pCVar4->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c1620;
  (pCVar4->description)._M_dataplus._M_p = (pointer)&(pCVar4->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar4->description,local_88,local_88 + local_80);
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c01b8;
  pCVar4[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar4->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_d0.ptr = pCVar4;
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_d0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_c8);
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar5->ptr != (CommandLineOption *)0x0) {
    (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar5->ptr = local_d0.ptr;
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"fov","");
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"--fov <float>: vertical field of view","");
  pCVar4 = (CommandLineOption *)operator_new(0x38);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_a8,local_a8 + local_a0);
  (pCVar4->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c1620;
  (pCVar4->description)._M_dataplus._M_p = (pointer)&(pCVar4->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar4->description,local_88,local_88 + local_80);
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c0208;
  pCVar4[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar4->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_d0.ptr = pCVar4;
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_d0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_c8);
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar5->ptr != (CommandLineOption *)0x0) {
    (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar5->ptr = local_d0.ptr;
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"lefthanded","");
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"--lefthanded: use left handed coordinates","");
  pCVar4 = (CommandLineOption *)operator_new(0x38);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_a8,local_a8 + local_a0);
  (pCVar4->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c1620;
  (pCVar4->description)._M_dataplus._M_p = (pointer)&(pCVar4->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar4->description,local_88,local_88 + local_80);
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c0258;
  pCVar4[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar4->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_d0.ptr = pCVar4;
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_d0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_c8);
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar5->ptr != (CommandLineOption *)0x0) {
    (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar5->ptr = local_d0.ptr;
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"righthanded","");
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"--righthanded: use right handed coordinates","");
  pCVar4 = (CommandLineOption *)operator_new(0x38);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_a8,local_a8 + local_a0);
  (pCVar4->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c1620;
  (pCVar4->description)._M_dataplus._M_p = (pointer)&(pCVar4->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar4->description,local_88,local_88 + local_80);
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c02a8;
  pCVar4[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar4->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_d0.ptr = pCVar4;
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_d0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_c8);
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar5->ptr != (CommandLineOption *)0x0) {
    (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar5->ptr = local_d0.ptr;
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"size","");
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"--size <width> <height>: sets image size","");
  pCVar4 = (CommandLineOption *)operator_new(0x38);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_a8,local_a8 + local_a0);
  (pCVar4->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c1620;
  (pCVar4->description)._M_dataplus._M_p = (pointer)&(pCVar4->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar4->description,local_88,local_88 + local_80);
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c02f8;
  pCVar4[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar4->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_d0.ptr = pCVar4;
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_d0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_c8);
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar5->ptr != (CommandLineOption *)0x0) {
    (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar5->ptr = local_d0.ptr;
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"fullscreen","");
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"--fullscreen: starts in fullscreen mode","");
  pCVar4 = (CommandLineOption *)operator_new(0x38);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_a8,local_a8 + local_a0);
  (pCVar4->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c1620;
  (pCVar4->description)._M_dataplus._M_p = (pointer)&(pCVar4->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar4->description,local_88,local_88 + local_80);
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c0348;
  pCVar4[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar4->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_d0.ptr = pCVar4;
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_d0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_c8);
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar5->ptr != (CommandLineOption *)0x0) {
    (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar5->ptr = local_d0.ptr;
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"print-frame-rate","");
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"--print-frame-rate: prints framerate for each frame on console",""
            );
  pCVar4 = (CommandLineOption *)operator_new(0x38);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_a8,local_a8 + local_a0);
  (pCVar4->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c1620;
  (pCVar4->description)._M_dataplus._M_p = (pointer)&(pCVar4->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar4->description,local_88,local_88 + local_80);
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c0398;
  pCVar4[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar4->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_d0.ptr = pCVar4;
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_d0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_c8);
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar5->ptr != (CommandLineOption *)0x0) {
    (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar5->ptr = local_d0.ptr;
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"print-camera","");
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"--print-camera: prints camera for each frame on console","");
  pCVar4 = (CommandLineOption *)operator_new(0x38);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_a8,local_a8 + local_a0);
  (pCVar4->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c1620;
  (pCVar4->description)._M_dataplus._M_p = (pointer)&(pCVar4->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar4->description,local_88,local_88 + local_80);
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c03e8;
  pCVar4[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar4->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_d0.ptr = pCVar4;
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_d0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_c8);
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar5->ptr != (CommandLineOption *)0x0) {
    (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar5->ptr = local_d0.ptr;
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"debug0","");
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"--debug0: sets internal debugging value","");
  pCVar4 = (CommandLineOption *)operator_new(0x38);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_a8,local_a8 + local_a0);
  (pCVar4->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c1620;
  (pCVar4->description)._M_dataplus._M_p = (pointer)&(pCVar4->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar4->description,local_88,local_88 + local_80);
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c0438;
  pCVar4[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar4->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_d0.ptr = pCVar4;
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_d0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_c8);
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar5->ptr != (CommandLineOption *)0x0) {
    (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar5->ptr = local_d0.ptr;
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"debug1","");
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"--debug1: sets internal debugging value","");
  pCVar4 = (CommandLineOption *)operator_new(0x38);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_a8,local_a8 + local_a0);
  (pCVar4->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c1620;
  (pCVar4->description)._M_dataplus._M_p = (pointer)&(pCVar4->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar4->description,local_88,local_88 + local_80);
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c0488;
  pCVar4[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar4->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_d0.ptr = pCVar4;
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_d0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_c8);
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar5->ptr != (CommandLineOption *)0x0) {
    (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar5->ptr = local_d0.ptr;
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"debug2","");
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"--debug2: sets internal debugging value","");
  pCVar4 = (CommandLineOption *)operator_new(0x38);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_a8,local_a8 + local_a0);
  (pCVar4->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c1620;
  (pCVar4->description)._M_dataplus._M_p = (pointer)&(pCVar4->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar4->description,local_88,local_88 + local_80);
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c04d8;
  pCVar4[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar4->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_d0.ptr = pCVar4;
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_d0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_c8);
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar5->ptr != (CommandLineOption *)0x0) {
    (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar5->ptr = local_d0.ptr;
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"debug3","");
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"--debug3: sets internal debugging value","");
  pCVar4 = (CommandLineOption *)operator_new(0x38);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_a8,local_a8 + local_a0);
  (pCVar4->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c1620;
  (pCVar4->description)._M_dataplus._M_p = (pointer)&(pCVar4->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar4->description,local_88,local_88 + local_80);
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c0528;
  pCVar4[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar4->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_d0.ptr = pCVar4;
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_d0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_c8);
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar5->ptr != (CommandLineOption *)0x0) {
    (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar5->ptr = local_d0.ptr;
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"time","");
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"--time: sets time for motion blur","");
  pCVar4 = (CommandLineOption *)operator_new(0x38);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_a8,local_a8 + local_a0);
  (pCVar4->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c1620;
  (pCVar4->description)._M_dataplus._M_p = (pointer)&(pCVar4->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar4->description,local_88,local_88 + local_80);
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c0578;
  pCVar4[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar4->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_d0.ptr = pCVar4;
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_d0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_c8);
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar5->ptr != (CommandLineOption *)0x0) {
    (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar5->ptr = local_d0.ptr;
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"coherent","");
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,
             "--coherent: force using RTC_RAY_QUERY_FLAG_COHERENT hint when tracing rays","");
  pCVar4 = (CommandLineOption *)operator_new(0x38);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_a8,local_a8 + local_a0);
  (pCVar4->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c1620;
  (pCVar4->description)._M_dataplus._M_p = (pointer)&(pCVar4->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar4->description,local_88,local_88 + local_80);
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c05c8;
  pCVar4[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar4->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_d0.ptr = pCVar4;
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_d0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_c8);
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar5->ptr != (CommandLineOption *)0x0) {
    (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar5->ptr = local_d0.ptr;
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"incoherent","");
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,
             "--incoherent: force using RTC_RAY_QUERY_FLAG_INCOHERENT hint when tracing rays","");
  pCVar4 = (CommandLineOption *)operator_new(0x38);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_a8,local_a8 + local_a0);
  (pCVar4->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c1620;
  (pCVar4->description)._M_dataplus._M_p = (pointer)&(pCVar4->description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar4->description,local_88,local_88 + local_80);
  (pCVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c0618;
  pCVar4[1].super_RefCount._vptr_RefCount = (_func_int **)this;
  LOCK();
  paVar1 = &(pCVar4->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_d0.ptr = pCVar4;
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  std::
  vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ::push_back(&this_00->commandLineOptionList,&local_d0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
           ::operator[](this_01,&local_c8);
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  if (pmVar5->ptr != (CommandLineOption *)0x0) {
    (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar5->ptr = local_d0.ptr;
  if (local_d0.ptr != (CommandLineOption *)0x0) {
    (*((local_d0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  return;
}

Assistant:

TutorialApplication::TutorialApplication (const std::string& tutorialName, int features, int w, int h)

    : Application(features),
      tutorialName(tutorialName),

      width(w),
      height(h),
      pixels(nullptr),

      outputImageFilename(""),
      referenceImageFilename(""),
      referenceImageThreshold(35.0f),

      interactive(true),
      fullscreen(false),

      window_width(1024),
      window_height(1024),

      time0(getSeconds()),
      debug_int0(0),
      debug_int1(0),

      mouseMode(0),
      clickX(0.0), clickY(0.0),
      speed(1.0f),
      moveDelta(zero),

      animate(true),
      render_time(0.f),

      command_line_camera(false),
      print_frame_rate(false),
      avg_render_time(64,1.0),
      avg_frame_time(64,1.0),
      avg_mrayps(64,1.0),
      print_camera(false),

      debug0(0),
      debug1(0),
      debug2(0),
      debug3(0),

      iflags_coherent(RTC_RAY_QUERY_FLAG_COHERENT),
      iflags_incoherent(RTC_RAY_QUERY_FLAG_INCOHERENT)
  {
    /* only a single instance of this class is supported */
    assert(instance == nullptr);
    instance = this;

    /* for best performance set FTZ and DAZ flags in MXCSR control and status register */
    _MM_SET_FLUSH_ZERO_MODE(_MM_FLUSH_ZERO_ON);
    _MM_SET_DENORMALS_ZERO_MODE(_MM_DENORMALS_ZERO_ON);

    registerOption("c", [this] (Ref<ParseStream> cin, const FileName& path) {
        FileName file = path + cin->getFileName();
        parseCommandLine(new ParseStream(new LineCommentFilter(file, "#")), file.path());
      }, "-c <filename>: parses command line option from <filename>");

    registerOption("o", [this] (Ref<ParseStream> cin, const FileName& path) {
        outputImageFilename = cin->getFileName();
        interactive = false;
      }, "-o <filename>: output image filename");

    registerOption("compare", [this] (Ref<ParseStream> cin, const FileName& path) {
        referenceImageFilename = cin->getFileName();
        interactive = false;
      }, "--compare <filename>: reference image to compare against");

    registerOption("compare-threshold", [this] (Ref<ParseStream> cin, const FileName& path) {
        referenceImageThreshold = cin->getFloat();
      }, "--compare-threshold <float>: threshold in number of wrong pixels when image is considered wrong");

    registerOption("frames", [this] (Ref<ParseStream> cin, const FileName& path) {
        numFrames = cin->getInt();
      }, "--frames <int>: number of frames to render in compare or output mode");

    /* camera settings */
    registerOption("vp", [this] (Ref<ParseStream> cin, const FileName& path) {
        camera.from = cin->getVec3fa();
        command_line_camera = true;
      }, "--vp <float> <float> <float>: camera position");

    registerOption("vi", [this] (Ref<ParseStream> cin, const FileName& path) {
        camera.to = cin->getVec3fa();
        command_line_camera = true;
      }, "--vi <float> <float> <float>: camera lookat position");

    registerOption("vd", [this] (Ref<ParseStream> cin, const FileName& path) {
        camera.to = camera.from + cin->getVec3fa();
        command_line_camera = true;
      }, "--vd <float> <float> <float>: camera direction vector");

    registerOption("vu", [this] (Ref<ParseStream> cin, const FileName& path) {
        camera.up = cin->getVec3fa();
        command_line_camera = true;
      }, "--vu <float> <float> <float>: camera up vector");

    registerOption("fov", [this] (Ref<ParseStream> cin, const FileName& path) {
        camera.fov = cin->getFloat();
        command_line_camera = true;
      }, "--fov <float>: vertical field of view");

    registerOption("lefthanded", [this] (Ref<ParseStream> cin, const FileName& path) {
        camera.handedness = Camera::LEFT_HANDED;
      }, "--lefthanded: use left handed coordinates");

    registerOption("righthanded", [this] (Ref<ParseStream> cin, const FileName& path) {
        camera.handedness = Camera::RIGHT_HANDED;
      }, "--righthanded: use right handed coordinates");

    /* framebuffer settings */
    registerOption("size", [this] (Ref<ParseStream> cin, const FileName& path) {
        width = cin->getInt();
        height = cin->getInt();
      }, "--size <width> <height>: sets image size");

    registerOption("fullscreen", [this] (Ref<ParseStream> cin, const FileName& path) {
        fullscreen = true;
      }, "--fullscreen: starts in fullscreen mode");

    registerOption("print-frame-rate", [this] (Ref<ParseStream> cin, const FileName& path) {
        print_frame_rate = true;
      }, "--print-frame-rate: prints framerate for each frame on console");

     registerOption("print-camera", [this] (Ref<ParseStream> cin, const FileName& path) {
         print_camera = true;
      }, "--print-camera: prints camera for each frame on console");

     registerOption("debug0", [this] (Ref<ParseStream> cin, const FileName& path) {
         debug0 = cin->getInt();
       }, "--debug0: sets internal debugging value");

     registerOption("debug1", [this] (Ref<ParseStream> cin, const FileName& path) {
         debug1 = cin->getInt();
       }, "--debug1: sets internal debugging value");

     registerOption("debug2", [this] (Ref<ParseStream> cin, const FileName& path) {
         debug2 = cin->getInt();
       }, "--debug2: sets internal debugging value");

     registerOption("debug3", [this] (Ref<ParseStream> cin, const FileName& path) {
         debug3 = cin->getInt();
       }, "--debug3: sets internal debugging value");

     registerOption("time", [this] (Ref<ParseStream> cin, const FileName& path) {
         g_motion_blur = false;
         animate = false;
         render_time = cin->getFloat();
         g_debug = render_time;
       }, "--time: sets time for motion blur");

    registerOption("coherent", [this] (Ref<ParseStream> cin, const FileName& path) {
        g_iflags_coherent   = iflags_coherent   = RTC_RAY_QUERY_FLAG_COHERENT;
        g_iflags_incoherent = iflags_incoherent = RTC_RAY_QUERY_FLAG_COHERENT;
      }, "--coherent: force using RTC_RAY_QUERY_FLAG_COHERENT hint when tracing rays");

    registerOption("incoherent", [this] (Ref<ParseStream> cin, const FileName& path) {
        g_iflags_coherent   = iflags_coherent   = RTC_RAY_QUERY_FLAG_INCOHERENT;
        g_iflags_incoherent = iflags_incoherent = RTC_RAY_QUERY_FLAG_INCOHERENT;
      }, "--incoherent: force using RTC_RAY_QUERY_FLAG_INCOHERENT hint when tracing rays");

#if defined(EMBREE_SYCL_TUTORIAL)
    registerOption("jit-cache", [this] (Ref<ParseStream> cin, const FileName& path) {
         jit_cache = cin->getInt();
       }, "--jit-cache <0/1>: enabled (1) or disables (0) JIT caching");
#endif
  }